

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrActiveActionSetPrioritiesEXT *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  long lVar3;
  XrResult XVar4;
  ulong uVar5;
  allocator local_179;
  GenValidUsageXrInstanceInfo *local_178;
  string *local_170;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_168;
  allocator local_159;
  string local_158;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string local_f8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_178 = instance_info;
  local_170 = command_name;
  local_168 = objects_info;
  if (value->type != XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrActiveActionSetPrioritiesEXT",value->type,
               "VUID-XrActiveActionSetPrioritiesEXT-type-type",
               XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT,"XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT");
  }
  if (!check_pnext) goto LAB_001a52e2;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(local_178,local_170,local_168,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_158);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_158,local_178,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string
              ((string *)&local_158,"VUID-XrActiveActionSetPrioritiesEXT-next-unique",&local_179);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,local_168);
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Multiple structures of the same type(s) in \"next\" chain for XrActiveActionSetPrioritiesEXT struct"
               ,&local_159);
    CoreValidLogMessage(local_178,&local_158,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_158);
LAB_001a52b0:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrActiveActionSetPrioritiesEXT-next-next",
               (allocator *)&local_f8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,local_168);
    std::__cxx11::string::string
              ((string *)&local_158,
               "Invalid structure(s) in \"next\" chain for XrActiveActionSetPrioritiesEXT struct \"next\""
               ,&local_179);
    CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_001a52b0;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001a52e2:
  if (check_members && XVar2 == XR_SUCCESS) {
    XVar2 = XR_SUCCESS;
    if ((value->actionSetPriorityCount == 0) &&
       (value->actionSetPriorities != (XrActiveActionSetPriorityEXT *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorityCount-arraylength",
                 (allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,local_168);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrActiveActionSetPrioritiesEXT member actionSetPriorityCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->actionSetPriorities == (XrActiveActionSetPriorityEXT *)0x0) {
      if (value->actionSetPriorityCount != 0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorities-parameter",
                   (allocator *)&local_f8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_a8,local_168);
        std::__cxx11::string::string
                  ((string *)&local_158,
                   "XrActiveActionSetPrioritiesEXT contains invalid NULL for XrActiveActionSetPriorityEXT \"actionSetPriorities\" is which not optional since \"actionSetPriorityCount\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_a8,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_a8);
        std::__cxx11::string::~string((string *)&error_message);
        XVar2 = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      uVar5 = 0xffffffffffffffff;
      lVar3 = 0;
      XVar4 = XVar2;
      do {
        uVar5 = uVar5 + 1;
        if (value->actionSetPriorityCount <= uVar5) {
          return XVar4;
        }
        XVar4 = XR_SUCCESS;
        XVar2 = ValidateXrStruct(local_178,local_170,local_168,true,false,
                                 (XrActiveActionSetPriorityEXT *)
                                 ((long)&value->actionSetPriorities->actionSet + lVar3));
        lVar3 = lVar3 + 0x10;
      } while (XVar2 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorities-parameter",
                 (allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_c0,local_168);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrActiveActionSetPrioritiesEXT member actionSetPriorities is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_c0,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_c0);
      std::__cxx11::string::~string((string *)&error_message);
    }
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrActiveActionSetPrioritiesEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrActiveActionSetPrioritiesEXT",
                             value->type, "VUID-XrActiveActionSetPrioritiesEXT-type-type", XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT, "XR_TYPE_ACTIVE_ACTION_SET_PRIORITIES_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrActiveActionSetPrioritiesEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrActiveActionSetPrioritiesEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrActiveActionSetPrioritiesEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrActiveActionSetPrioritiesEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrActiveActionSetPrioritiesEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->actionSetPriorityCount && nullptr != value->actionSetPriorities) {
        CoreValidLogMessage(instance_info, "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorityCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrActiveActionSetPrioritiesEXT member actionSetPriorityCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->actionSetPriorities && 0 != value->actionSetPriorityCount) {
        CoreValidLogMessage(instance_info, "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorities-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrActiveActionSetPrioritiesEXT contains invalid NULL for XrActiveActionSetPriorityEXT \"actionSetPriorities\" is which not "
                            "optional since \"actionSetPriorityCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->actionSetPriorities) {
        for (uint32_t value_actionsetpriorities_inc = 0; value_actionsetpriorities_inc < value->actionSetPriorityCount; ++value_actionsetpriorities_inc) {
            // Validate that the structure XrActiveActionSetPriorityEXT is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->actionSetPriorities[value_actionsetpriorities_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrActiveActionSetPrioritiesEXT-actionSetPriorities-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrActiveActionSetPrioritiesEXT member actionSetPriorities is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}